

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgException.h
# Opt level: O1

char * __thiscall TCLAP::ArgException::what(ArgException *this)

{
  pointer pcVar1;
  long *plVar2;
  long *plVar3;
  long *local_58 [2];
  long local_48 [2];
  long *local_38;
  long local_30;
  long local_28;
  long lStack_20;
  
  if (what()::ex_abi_cxx11_ == '\0') {
    what();
  }
  pcVar1 = (this->_argId)._M_dataplus._M_p;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar1,pcVar1 + (this->_argId)._M_string_length);
  std::__cxx11::string::append((char *)local_58);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_58,(ulong)(this->_errorText)._M_dataplus._M_p);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_28 = *plVar3;
    lStack_20 = plVar2[3];
    local_38 = &local_28;
  }
  else {
    local_28 = *plVar3;
    local_38 = (long *)*plVar2;
  }
  local_30 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)&what()::ex_abi_cxx11_,(string *)&local_38);
  if (local_38 != &local_28) {
    operator_delete(local_38,local_28 + 1);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  return what()::ex_abi_cxx11_._M_dataplus._M_p;
}

Assistant:

const char* what() const throw() 
		{
			static std::string ex; 
			ex = _argId + " -- " + _errorText;
			return ex.c_str();
		}